

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

void __thiscall QToolButton::showMenu(QToolButton *this)

{
  byte bVar1;
  QToolButtonPrivate *this_00;
  bool bVar2;
  
  this_00 = *(QToolButtonPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  bVar2 = QToolButtonPrivate::hasMenu(this_00);
  bVar1 = this_00->field_0x2ec;
  if (bVar2) {
    if ((bVar1 & 4) == 0) {
      this_00->field_0x2ec = bVar1 | 4;
      QWidget::repaint((QWidget *)this);
      QBasicTimer::stop();
      QToolButtonPrivate::popupTimerDone(this_00);
      return;
    }
  }
  else {
    this_00->field_0x2ec = bVar1 & 0xfb;
  }
  return;
}

Assistant:

void QToolButton::showMenu()
{
    Q_D(QToolButton);
    if (!d->hasMenu()) {
        d->menuButtonDown = false;
        return; // no menu to show
    }
    // prevent recursions spinning another event loop
    if (d->menuButtonDown)
        return;


    d->menuButtonDown = true;
    repaint();
    d->popupTimer.stop();
    d->popupTimerDone();
}